

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O3

void __thiscall leveldb::VersionEdit::EncodeTo(VersionEdit *this,string *dst)

{
  pointer ppVar1;
  size_type sVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  pointer ppVar5;
  long lVar6;
  long in_FS_OFFSET;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->has_comparator_ == true) {
    PutVarint32(dst,1);
    local_48.data_ = (this->comparator_)._M_dataplus._M_p;
    local_48.size_ = (this->comparator_)._M_string_length;
    PutLengthPrefixedSlice(dst,&local_48);
  }
  if (this->has_log_number_ == true) {
    PutVarint32(dst,2);
    PutVarint64(dst,this->log_number_);
  }
  if (this->has_prev_log_number_ == true) {
    PutVarint32(dst,9);
    PutVarint64(dst,this->prev_log_number_);
  }
  if (this->has_next_file_number_ == true) {
    PutVarint32(dst,3);
    PutVarint64(dst,this->next_file_number_);
  }
  if (this->has_last_sequence_ == true) {
    PutVarint32(dst,4);
    PutVarint64(dst,this->last_sequence_);
  }
  if ((this->compact_pointers_).
      super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->compact_pointers_).
      super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      PutVarint32(dst,5);
      PutVarint32(dst,*(uint32_t *)
                       ((long)&((this->compact_pointers_).
                                super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first + lVar6));
      ppVar1 = (this->compact_pointers_).
               super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar2 = *(size_type *)((long)&(ppVar1->second).rep_._M_string_length + lVar6);
      if (sVar2 == 0) goto LAB_00645135;
      local_48.data_ = *(char **)((long)&(ppVar1->second).rep_._M_dataplus + lVar6);
      local_48.size_ = sVar2;
      PutLengthPrefixedSlice(dst,&local_48);
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 0x28;
    } while (uVar4 < (ulong)(((long)(this->compact_pointers_).
                                    super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->compact_pointers_).
                                    super__Vector_base<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333));
  }
  for (p_Var3 = (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->deleted_files_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
    PutVarint32(dst,6);
    PutVarint32(dst,p_Var3[1]._M_color);
    PutVarint64(dst,(uint64_t)p_Var3[1]._M_parent);
  }
  ppVar5 = (this->new_files_).
           super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->new_files_).
      super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar5) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      PutVarint32(dst,7);
      PutVarint32(dst,*(uint32_t *)
                       ((long)&((this->new_files_).
                                super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first + lVar6));
      PutVarint64(dst,*(uint64_t *)((long)&(ppVar5->second).number + lVar6));
      PutVarint64(dst,*(uint64_t *)((long)&(ppVar5->second).file_size + lVar6));
      sVar2 = *(size_type *)((long)&(ppVar5->second).smallest.rep_._M_string_length + lVar6);
      if (sVar2 == 0) {
LAB_00645135:
        __assert_fail("!rep_.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/dbformat.h"
                      ,0x96,"Slice leveldb::InternalKey::Encode() const");
      }
      local_48.data_ = *(char **)((long)&(ppVar5->second).smallest.rep_._M_dataplus._M_p + lVar6);
      local_48.size_ = sVar2;
      PutLengthPrefixedSlice(dst,&local_48);
      sVar2 = *(size_type *)((long)&(ppVar5->second).largest.rep_._M_string_length + lVar6);
      if (sVar2 == 0) goto LAB_00645135;
      local_48.data_ = *(char **)((long)&(ppVar5->second).largest.rep_._M_dataplus._M_p + lVar6);
      local_48.size_ = sVar2;
      PutLengthPrefixedSlice(dst,&local_48);
      uVar4 = uVar4 + 1;
      ppVar5 = (this->new_files_).
               super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x60;
    } while (uVar4 < (ulong)(((long)(this->new_files_).
                                    super__Vector_base<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >> 5)
                            * -0x5555555555555555));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VersionEdit::EncodeTo(std::string* dst) const {
  if (has_comparator_) {
    PutVarint32(dst, kComparator);
    PutLengthPrefixedSlice(dst, comparator_);
  }
  if (has_log_number_) {
    PutVarint32(dst, kLogNumber);
    PutVarint64(dst, log_number_);
  }
  if (has_prev_log_number_) {
    PutVarint32(dst, kPrevLogNumber);
    PutVarint64(dst, prev_log_number_);
  }
  if (has_next_file_number_) {
    PutVarint32(dst, kNextFileNumber);
    PutVarint64(dst, next_file_number_);
  }
  if (has_last_sequence_) {
    PutVarint32(dst, kLastSequence);
    PutVarint64(dst, last_sequence_);
  }

  for (size_t i = 0; i < compact_pointers_.size(); i++) {
    PutVarint32(dst, kCompactPointer);
    PutVarint32(dst, compact_pointers_[i].first);  // level
    PutLengthPrefixedSlice(dst, compact_pointers_[i].second.Encode());
  }

  for (const auto& deleted_file_kvp : deleted_files_) {
    PutVarint32(dst, kDeletedFile);
    PutVarint32(dst, deleted_file_kvp.first);   // level
    PutVarint64(dst, deleted_file_kvp.second);  // file number
  }

  for (size_t i = 0; i < new_files_.size(); i++) {
    const FileMetaData& f = new_files_[i].second;
    PutVarint32(dst, kNewFile);
    PutVarint32(dst, new_files_[i].first);  // level
    PutVarint64(dst, f.number);
    PutVarint64(dst, f.file_size);
    PutLengthPrefixedSlice(dst, f.smallest.Encode());
    PutLengthPrefixedSlice(dst, f.largest.Encode());
  }
}